

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_8::DiskHandle::read(DiskHandle *this,int __fd,void *__buf,size_t __nbytes)

{
  int osErrorNumber;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  long lVar2;
  long __offset;
  Fault f;
  Fault FStack_38;
  
  __offset = CONCAT44(in_register_00000034,__fd);
  lVar2 = 0;
  do {
    if (__nbytes == 0) {
      return lVar2;
    }
    do {
      sVar1 = pread((this->fd).fd,__buf,__nbytes,__offset);
      if (-1 < sVar1) {
        if (sVar1 == 0) {
          return lVar2;
        }
        goto LAB_004c059f;
      }
      osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
    } while (osErrorNumber == -1);
    if (osErrorNumber != 0) {
      kj::_::Debug::Fault::Fault
                (&FStack_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x153,osErrorNumber,"n = pread(fd, buffer.begin(), buffer.size(), offset)","");
      kj::_::Debug::Fault::fatal(&FStack_38);
    }
LAB_004c059f:
    lVar2 = lVar2 + sVar1;
    __offset = __offset + sVar1;
    __buf = (void *)((long)__buf + sVar1);
    __nbytes = __nbytes - sVar1;
  } while( true );
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const {
    // pread() probably never returns short reads unless it hits EOF. Unfortunately, though, per
    // spec we are not allowed to assume this.

    size_t total = 0;
    while (buffer.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pread(fd, buffer.begin(), buffer.size(), offset));
      if (n == 0) break;
      total += n;
      offset += n;
      buffer = buffer.slice(n, buffer.size());
    }
    return total;
  }